

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

bool xla::ForwardDFS(Rep *r,int32_t n,int32_t upper_bound)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pNVar4;
  pointer pNVar5;
  int *piVar6;
  int *piVar7;
  int w;
  int32_t local_48;
  int local_44;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  piVar2 = (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_40 = &r->stack_;
  piVar2 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if ((r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_38 = &r->deltaf_;
  local_48 = n;
  std::vector<int,_std::allocator<int>_>::push_back(local_40,&local_48);
  while( true ) {
    piVar2 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar2 == piVar3) break;
    local_48 = piVar3[-1];
    (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3 + -1;
    pNVar4 = (r->nodes_).
             super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pNVar4[local_48].visited == false) {
      pNVar4[local_48].visited = true;
      std::vector<int,_std::allocator<int>_>::push_back(local_38,&local_48);
      pNVar5 = (r->node_io_).
               super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar6 = *(pointer *)
                ((long)&pNVar5[local_48].out.value_sequence_.
                        super__Vector_base<int,_std::allocator<int>_> + 8);
      for (piVar7 = *(int **)&pNVar5[local_48].out.value_sequence_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl;
          piVar7 != piVar6; piVar7 = piVar7 + 1) {
        local_44 = *piVar7;
        pNVar4 = (r->nodes_).
                 super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar1 = pNVar4[local_44].rank;
        if (iVar1 == upper_bound) goto LAB_001829fa;
        if ((iVar1 < upper_bound) && (pNVar4[local_44].visited == false)) {
          std::vector<int,_std::allocator<int>_>::push_back(local_40,&local_44);
        }
      }
    }
  }
LAB_001829fa:
  return piVar2 == piVar3;
}

Assistant:

static bool ForwardDFS(GraphCycles::Rep* r, int32_t n, int32_t upper_bound) {
  // Avoid recursion since stack space might be limited.
  // We instead keep a stack of nodes to visit.
  r->deltaf_.clear();
  r->stack_.clear();
  r->stack_.push_back(n);
  while (!r->stack_.empty()) {
    n = r->stack_.back();
    r->stack_.pop_back();
    Node* nn = &r->nodes_[n];
    if (nn->visited) continue;

    nn->visited = true;
    r->deltaf_.push_back(n);

    NodeIO* nn_io = &r->node_io_[n];
    for (auto w : nn_io->out.GetSequence()) {
      Node* nw = &r->nodes_[w];
      if (nw->rank == upper_bound) {
        return false;  // Cycle
      }
      if (!nw->visited && nw->rank < upper_bound) {
        r->stack_.push_back(w);
      }
    }
  }
  return true;
}